

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockExpectedCall_callOrderIsFulfilledMultiple_TestShell::createTest
          (TEST_MockExpectedCall_callOrderIsFulfilledMultiple_TestShell *this)

{
  TEST_MockExpectedCall_callOrderIsFulfilledMultiple_Test *this_00;
  
  this_00 = (TEST_MockExpectedCall_callOrderIsFulfilledMultiple_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                         ,0x2bd);
  TEST_MockExpectedCall_callOrderIsFulfilledMultiple_Test::
  TEST_MockExpectedCall_callOrderIsFulfilledMultiple_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockExpectedCall, callOrderIsFulfilledMultiple)
{
    MockCheckedExpectedCall expectedCall(4);
    expectedCall.withName("name");
    expectedCall.withCallOrder(150, 153);
    expectedCall.callWasMade(150);
    expectedCall.callWasMade(151);
    expectedCall.callWasMade(152);
    expectedCall.callWasMade(153);
    CHECK(expectedCall.isFulfilled());
    CHECK_FALSE(expectedCall.isOutOfOrder());
}